

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<char[100],unsigned_long,char[3],char[5]>
          (Capturer *this,size_t index,char (*value) [100],unsigned_long *values,
          char (*values_1) [3],char (*values_2) [5])

{
  string local_58;
  char (*local_38) [5];
  char (*values_local_2) [5];
  char (*values_local_1) [3];
  unsigned_long *values_local;
  char (*value_local) [100];
  size_t index_local;
  Capturer *this_local;
  
  local_38 = values_2;
  values_local_2 = (char (*) [5])values_1;
  values_local_1 = (char (*) [3])values;
  values_local = (unsigned_long *)value;
  value_local = (char (*) [100])index;
  index_local = (size_t)this;
  Detail::stringify<char[100]>(&local_58,value);
  captureValue(this,index,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  captureValues<unsigned_long,char[3],char[5]>
            (this,(size_t)(*value_local + 1),(unsigned_long *)values_local_1,
             (char (*) [3])values_local_2,local_38);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }